

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

btScalar btShortestAngleUpdate(btScalar accAngle,btScalar curAngle)

{
  float in_XMM0_Da;
  btScalar x;
  btScalar bVar1;
  btScalar in_XMM1_Da;
  btScalar result;
  btScalar tol;
  float fVar2;
  undefined4 local_4;
  
  fVar2 = 0.3;
  x = btShortestAngularDistance(in_XMM1_Da,0.3);
  bVar1 = btFabs(x);
  local_4 = in_XMM1_Da;
  if (bVar1 <= fVar2) {
    local_4 = in_XMM0_Da + x;
  }
  return local_4;
}

Assistant:

static btScalar btShortestAngleUpdate(btScalar accAngle, btScalar curAngle)
{
	btScalar tol(0.3);
	btScalar result = btShortestAngularDistance(accAngle, curAngle);

	  if (btFabs(result) > tol)
		return curAngle;
	  else
		return accAngle + result;

	return curAngle;
}